

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void cmLGInfoProp(cmMakefile *mf,cmGeneratorTarget *target,string *prop)

{
  cmValue cVar1;
  string_view value;
  
  cVar1 = cmGeneratorTarget::GetProperty(target,prop);
  if (cVar1.Value != (string *)0x0) {
    value._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar1.Value)->_M_string_length;
    cmMakefile::AddDefinition(mf,prop,value);
    return;
  }
  return;
}

Assistant:

static void cmLGInfoProp(cmMakefile* mf, cmGeneratorTarget* target,
                         const std::string& prop)
{
  if (cmValue val = target->GetProperty(prop)) {
    mf->AddDefinition(prop, *val);
  }
}